

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL MoveFileW(LPCWSTR lpExistingFileName,LPCWSTR lpNewFileName)

{
  BOOL BVar1;
  BOOL bRet;
  LPCWSTR lpNewFileName_local;
  LPCWSTR lpExistingFileName_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  BVar1 = MoveFileExW(lpExistingFileName,lpNewFileName,2);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return BVar1;
  }
  abort();
}

Assistant:

BOOL
PALAPI
MoveFileW(
     IN LPCWSTR lpExistingFileName,
     IN LPCWSTR lpNewFileName)
{
    BOOL bRet;

    PERF_ENTRY(MoveFileW);
    ENTRY("MoveFileW(lpExistingFileName=%p (%S), lpNewFileName=%p (%S))\n",
          lpExistingFileName?lpExistingFileName:W16_NULLSTRING,
          lpExistingFileName?lpExistingFileName:W16_NULLSTRING,
          lpNewFileName?lpNewFileName:W16_NULLSTRING,
          lpNewFileName?lpNewFileName:W16_NULLSTRING);

    bRet = MoveFileExW( lpExistingFileName,
            lpNewFileName,
            MOVEFILE_COPY_ALLOWED );

    LOGEXIT("MoveFileW returns BOOL %d\n", bRet);
    PERF_EXIT(MoveFileW);
    return bRet;
}